

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O2

void __thiscall
hdc::IfStatement::IfStatement
          (IfStatement *this,Expression *expression,CompoundStatement *statements,
          ElifStatement *elifStatement)

{
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019c0e0;
  this->expression = expression;
  this->statements = statements;
  this->elifStatement = elifStatement;
  this->elseStatement = (ElseStatement *)0x0;
  this->symbolTable = (SymbolTable *)0x0;
  ASTNode::setKind((ASTNode *)this,AST_IF);
  return;
}

Assistant:

IfStatement::IfStatement(Expression* expression, CompoundStatement* statements, ElifStatement* elifStatement) {
    this->expression = expression;
    this->statements = statements;
    this->elifStatement = elifStatement;
    this->elseStatement = nullptr;
    this->symbolTable = nullptr;
    setKind(AST_IF);
}